

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

int If_Dec6DeriveCount2(word t,int *pCof0,int *pCof1)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar1 = (uint)t & 0xf;
  *pCof0 = uVar1;
  *pCof1 = uVar1;
  uVar2 = 0;
  uVar1 = 1;
  for (lVar3 = 4; lVar3 != 0x40; lVar3 = lVar3 + 4) {
    uVar4 = (uint)(t >> ((byte)lVar3 & 0x3f)) & 0xf;
    if ((ulong)uVar4 != (long)*pCof0) {
      *pCof1 = uVar4;
      uVar2 = uVar2 | 1 << (uVar1 & 0x1f);
    }
    uVar1 = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

static inline int If_Dec6DeriveCount2( word t, int * pCof0, int * pCof1 )
{
    int i, Mask = 0;
    *pCof0 = (t & 15);
    *pCof1 = (t & 15);
    for ( i = 1; i < 16; i++ )
        if ( *pCof0 != ((t >> (i<<2)) & 15) )
        {
            *pCof1 = ((t >> (i<<2)) & 15);
            Mask |= (1 << i);
        }
    return Mask;
}